

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O3

bool WAsmJs::ShouldJitFunction(FunctionBody *body,uint interpretedCount)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  ScriptContext *pSVar6;
  
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
  pFVar5 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0095923c;
    *puVar4 = 0;
    pFVar5 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,BackEndPhase,uVar3,pFVar5->functionId);
  if (!bVar2) {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
    pFVar5 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar5 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
LAB_0095923c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pFVar5 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FullJitPhase,uVar3,pFVar5->functionId);
    if (((!bVar2) &&
        (pSVar6 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body),
        (pSVar6->config).NoNative == false)) && (-1 < *(int *)&body->field_0x178)) {
      bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,ForceNativeFlag);
      if (bVar2) {
        return true;
      }
      if (DAT_015a4df8 <= interpretedCount) {
        return true;
      }
      return DAT_015a4e08 <= interpretedCount;
    }
  }
  return false;
}

Assistant:

bool ShouldJitFunction(Js::FunctionBody* body, uint interpretedCount)
    {
#if ENABLE_NATIVE_CODEGEN
        if (PHASE_OFF(Js::BackEndPhase, body) ||
            PHASE_OFF(Js::FullJitPhase, body) ||
            body->GetScriptContext()->GetConfig()->IsNoNative() ||
            body->GetIsAsmJsFullJitScheduled())
        {
            return false;
        }
#if ENABLE_OOP_NATIVE_CODEGEN
        if (JITManager::GetJITManager()->IsOOPJITEnabled() && !JITManager::GetJITManager()->IsConnected())
        {
            return false;
        }
#endif
        const bool forceNative = CONFIG_ISENABLED(Js::ForceNativeFlag);
        const uint minAsmJsInterpretRunCount = (uint)CONFIG_FLAG(MinAsmJsInterpreterRunCount);
        const uint maxAsmJsInterpretRunCount = (uint)CONFIG_FLAG(MaxAsmJsInterpreterRunCount);
        return forceNative || interpretedCount >= minAsmJsInterpretRunCount || interpretedCount >= maxAsmJsInterpretRunCount;
#else
        return false;
#endif
    }